

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_number_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSValue JVar1;
  JSValue obj;
  
  if (argc == 0) {
    JVar1 = (JSValue)ZEXT816(0);
  }
  else {
    JVar1 = *argv;
    if (0xfffffff4 < (uint)argv->tag) {
      *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
    }
    JVar1 = JS_ToNumberHintFree(ctx,JVar1,argc);
    if ((int)JVar1.tag == 6) {
      return JVar1;
    }
  }
  obj = JVar1;
  if (((int)new_target.tag != 3) && (obj = js_create_from_ctor(ctx,new_target,4), (int)obj.tag != 6)
     ) {
    JS_SetObjectData(ctx,obj,JVar1);
  }
  return obj;
}

Assistant:

static JSValue js_number_constructor(JSContext *ctx, JSValueConst new_target,
                                     int argc, JSValueConst *argv)
{
    JSValue val, obj;
    if (argc == 0) {
        val = JS_NewInt32(ctx, 0);
    } else {
        val = JS_ToNumeric(ctx, argv[0]);
        if (JS_IsException(val))
            return val;
        switch(JS_VALUE_GET_TAG(val)) {
#ifdef CONFIG_BIGNUM
        case JS_TAG_BIG_INT:
        case JS_TAG_BIG_FLOAT:
            {
                JSBigFloat *p = JS_VALUE_GET_PTR(val);
                double d;
                bf_get_float64(&p->num, &d, BF_RNDN);
                JS_FreeValue(ctx, val);
                val = __JS_NewFloat64(ctx, d);
            }
            break;
        case JS_TAG_BIG_DECIMAL:
            val = JS_ToStringFree(ctx, val);
            if (JS_IsException(val))
                return val;
            val = JS_ToNumberFree(ctx, val);
            if (JS_IsException(val))
                return val;
            break;
#endif
        default:
            break;
        }
    }
    if (!JS_IsUndefined(new_target)) {
        obj = js_create_from_ctor(ctx, new_target, JS_CLASS_NUMBER);
        if (!JS_IsException(obj))
            JS_SetObjectData(ctx, obj, val);
        return obj;
    } else {
        return val;
    }
}